

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

void __thiscall Assimp::CFIReaderImpl::parseElement(CFIReaderImpl *this)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  DeadlyImportError *pDVar4;
  string *psVar5;
  ulong uVar6;
  QName *pQVar7;
  undefined1 local_288 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  Attribute attr_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  QName *local_158;
  QName *elemName;
  undefined1 local_130 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8 [32];
  string local_d8 [32];
  undefined1 local_b8 [8];
  Attribute attr;
  bool hasAttributes;
  uint8_t b;
  CFIReaderImpl *this_local;
  
  std::vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>::
  clear(&this->attributes);
  bVar1 = *this->dataP;
  if ((bVar1 & 0x3f) == 0x38) {
    this->dataP = this->dataP + 1;
    while( true ) {
      if ((long)this->dataEnd - (long)this->dataP < 1) {
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar4,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      pbVar3 = this->dataP;
      this->dataP = pbVar3 + 1;
      bVar2 = *pbVar3;
      if (bVar2 == 0xf0) break;
      if ((bVar2 & 0xfc) != 0xcc) {
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar4,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      Attribute::Attribute((Attribute *)local_b8);
      std::__cxx11::string::operator=((string *)local_b8,"xmlns");
      if ((bVar2 & 2) == 0) {
        std::__cxx11::string::string(local_d8);
      }
      else {
        psVar5 = parseIdentifyingStringOrIndex(this,&(this->vocabulary).prefixTable);
        std::__cxx11::string::string(local_d8,(string *)psVar5);
      }
      std::__cxx11::string::operator=((string *)(attr.qname.uri.field_2._M_local_buf + 8),local_d8);
      std::__cxx11::string::~string(local_d8);
      if ((bVar2 & 1) == 0) {
        std::__cxx11::string::string(local_f8);
      }
      else {
        psVar5 = parseIdentifyingStringOrIndex(this,&(this->vocabulary).namespaceNameTable);
        std::__cxx11::string::string(local_f8,(string *)psVar5);
      }
      std::__cxx11::string::operator=
                ((string *)(attr.qname.prefix.field_2._M_local_buf + 8),local_f8);
      std::__cxx11::string::~string(local_f8);
      uVar6 = std::__cxx11::string::empty();
      local_130[0x16] = 0;
      if ((uVar6 & 1) == 0) {
        std::operator+(&local_118,"xmlns:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&attr.qname.uri.field_2 + 8));
      }
      else {
        std::allocator<char>::allocator();
        local_130[0x16] = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"xmlns",(allocator<char> *)(local_130 + 0x17));
      }
      std::__cxx11::string::operator=
                ((string *)(attr.qname.name.field_2._M_local_buf + 8),(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      if ((local_130[0x16] & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(local_130 + 0x17));
      }
      std::__cxx11::string::string
                ((string *)&elemName,(string *)(attr.qname.prefix.field_2._M_local_buf + 8));
      FIStringValue::create((FIStringValue *)local_130,(string *)&elemName);
      std::shared_ptr<Assimp::FIValue_const>::operator=
                ((shared_ptr<Assimp::FIValue_const> *)(attr.name.field_2._M_local_buf + 8),
                 (shared_ptr<Assimp::FIStringValue> *)local_130);
      std::shared_ptr<Assimp::FIStringValue>::~shared_ptr
                ((shared_ptr<Assimp::FIStringValue> *)local_130);
      std::__cxx11::string::~string((string *)&elemName);
      std::
      vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>::
      push_back(&this->attributes,(value_type *)local_b8);
      Attribute::~Attribute((Attribute *)local_b8);
    }
    if (((long)this->dataEnd - (long)this->dataP < 1) || ((*this->dataP & 0xc0) != 0)) {
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar4,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  local_158 = parseQualifiedNameOrIndex3(this,&(this->vocabulary).elementNameTable);
  uVar6 = std::__cxx11::string::empty();
  attr_1.value.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  if ((uVar6 & 1) == 0) {
    std::operator+(&local_198,&local_158->prefix,':');
    attr_1.value.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._7_1_ = 1;
    std::operator+(&local_178,&local_198,&local_158->name);
  }
  else {
    std::__cxx11::string::string((string *)&local_178,(string *)&local_158->name);
  }
  std::__cxx11::string::operator=((string *)&this->nodeName,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  if ((attr_1.value.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_198);
  }
  if ((bVar1 & 0x40) == 0) {
    if ((long)this->dataEnd - (long)this->dataP < 1) {
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar4,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    if (*this->dataP != 0xf0) {
      if (*this->dataP != 0xff) {
        this->emptyElement = false;
        goto LAB_00901d64;
      }
      this->terminatorPending = true;
    }
    this->emptyElement = true;
    this->dataP = this->dataP + 1;
  }
  else {
    while( true ) {
      if ((long)this->dataEnd - (long)this->dataP < 1) {
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar4,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      bVar1 = *this->dataP;
      if (0x7f < bVar1) break;
      Attribute::Attribute((Attribute *)local_230);
      pQVar7 = parseQualifiedNameOrIndex2(this,&(this->vocabulary).attributeNameTable);
      QName::operator=((QName *)local_230,pQVar7);
      uVar6 = std::__cxx11::string::empty();
      local_288[0x17] = 0;
      if ((uVar6 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_288 + 0x18),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_230,':');
        local_288[0x17] = 1;
        std::operator+(&local_250,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_288 + 0x18),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&attr_1.qname.uri.field_2 + 8));
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_250,(string *)(attr_1.qname.uri.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::operator=
                ((string *)(attr_1.qname.name.field_2._M_local_buf + 8),(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      if ((local_288[0x17] & 1) != 0) {
        std::__cxx11::string::~string((string *)(local_288 + 0x18));
      }
      if ((long)this->dataEnd - (long)this->dataP < 1) {
        pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar4,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      parseNonIdentifyingStringOrIndex1
                ((CFIReaderImpl *)local_288,
                 (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                  *)this);
      std::shared_ptr<const_Assimp::FIValue>::operator=
                ((shared_ptr<const_Assimp::FIValue> *)((long)&attr_1.name.field_2 + 8),
                 (shared_ptr<const_Assimp::FIValue> *)local_288);
      std::shared_ptr<const_Assimp::FIValue>::~shared_ptr
                ((shared_ptr<const_Assimp::FIValue> *)local_288);
      std::
      vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>::
      push_back(&this->attributes,(value_type *)local_230);
      Attribute::~Attribute((Attribute *)local_230);
    }
    if ((bVar1 & 0xf0) != 0xf0) {
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar4,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    this->emptyElement = bVar1 == 0xff;
    this->dataP = this->dataP + 1;
  }
LAB_00901d64:
  if ((this->emptyElement & 1U) == 0) {
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push(&this->elementStack,&this->nodeName);
  }
  this->currentNodeType = EXN_ELEMENT;
  return;
}

Assistant:

void parseElement() {
        // C.3

        attributes.clear();

        uint8_t b = *dataP;
        bool hasAttributes = (b & 0x40) != 0; // C.3.3
        if ((b & 0x3f) == 0x38) { // C.3.4.1
            // Parse namespaces
            ++dataP;
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                b = *dataP++;
                if (b == 0xf0) { // C.3.4.3
                    break;
                }
                if ((b & 0xfc) != 0xcc) { // C.3.4.2
                    throw DeadlyImportError(parseErrorMessage);
                }
                // C.12
                Attribute attr;
                attr.qname.prefix = "xmlns";
                attr.qname.name = b & 0x02 ? parseIdentifyingStringOrIndex(vocabulary.prefixTable) : std::string();
                attr.qname.uri = b & 0x01 ? parseIdentifyingStringOrIndex(vocabulary.namespaceNameTable) : std::string();
                attr.name = attr.qname.name.empty() ? "xmlns" : "xmlns:" + attr.qname.name;
                attr.value = FIStringValue::create(std::string(attr.qname.uri));
                attributes.push_back(attr);
            }
            if ((dataEnd - dataP < 1) || (*dataP & 0xc0)) {
                throw DeadlyImportError(parseErrorMessage);
            }
        }

        // Parse Element name (C.3.5)
        const QName &elemName = parseQualifiedNameOrIndex3(vocabulary.elementNameTable);
        nodeName = elemName.prefix.empty() ? elemName.name : elemName.prefix + ':' + elemName.name;

        if (hasAttributes) {
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                b = *dataP;
                if (b < 0x80) { // C.3.6.1
                    // C.4
                    Attribute attr;
                    attr.qname = parseQualifiedNameOrIndex2(vocabulary.attributeNameTable);
                    attr.name = attr.qname.prefix.empty() ? attr.qname.name : attr.qname.prefix + ':' + attr.qname.name;
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    attr.value = parseNonIdentifyingStringOrIndex1(vocabulary.attributeValueTable);
                    attributes.push_back(attr);
                }
                else {
                    if ((b & 0xf0) != 0xf0) { // C.3.6.2
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    emptyElement = b == 0xff; // C.3.6.2, C.3.8
                    ++dataP;
                    break;
                }
            }
        }
        else {
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            b = *dataP;
            switch (b) {
            case 0xff:
                terminatorPending = true;
                // Intentionally fall through
            case 0xf0:
                emptyElement = true;
                ++dataP;
                break;
            default:
                emptyElement = false;
            }
        }
        if (!emptyElement) {
            elementStack.push(nodeName);
        }

        currentNodeType = irr::io::EXN_ELEMENT;
    }